

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O2

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  uInt uVar4;
  LogMessage *other;
  bool bVar5;
  LogMessage local_78;
  int *local_40;
  LogFinisher local_31;
  
  ppvVar1 = &this->sub_data_;
  local_40 = &this->sub_data_size_;
  bVar5 = (this->zcontext_).avail_out == 0;
  do {
    piVar2 = local_40;
    if ((*ppvVar1 == (void *)0x0) || (bVar5)) {
      iVar3 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])
                        (this->sub_stream_,ppvVar1,local_40);
      if ((char)iVar3 == '\0') {
        iVar3 = -5;
        goto LAB_002fbb72;
      }
      uVar4 = *piVar2;
      if ((int)uVar4 < 1) {
        internal::LogMessage::LogMessage
                  (&local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/gzip_stream.cc"
                   ,0x105);
        other = internal::LogMessage::operator<<(&local_78,"CHECK failed: (sub_data_size_) > (0): ")
        ;
        internal::LogFinisher::operator=(&local_31,other);
        internal::LogMessage::~LogMessage(&local_78);
        uVar4 = *piVar2;
      }
      (this->zcontext_).next_out = (Bytef *)this->sub_data_;
      (this->zcontext_).avail_out = uVar4;
    }
    iVar3 = deflate(&this->zcontext_,flush);
    bVar5 = true;
  } while (iVar3 == 0 && (this->zcontext_).avail_out == 0);
  if (flush - 3U < 2) {
    (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])();
LAB_002fbb72:
    *ppvVar1 = (void *)0x0;
    *local_40 = 0;
  }
  return iVar3;
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      GOOGLE_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}